

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestResultParser.cpp
# Opt level: O1

void __thiscall xe::TestResultParser::updateCurrentItemList(TestResultParser *this)

{
  pointer ppIVar1;
  pointer ppIVar2;
  List *pLVar3;
  uint uVar4;
  
  this->m_curItemList = (List *)0x0;
  ppIVar1 = (this->m_itemStack).super__Vector_base<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppIVar2 = (this->m_itemStack).super__Vector_base<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  pLVar3 = (List *)0x0;
  do {
    if (ppIVar2 == ppIVar1) break;
    uVar4 = ppIVar2[-1]->m_type - TYPE_IMAGESET;
    if ((uVar4 < 9) && ((0x185U >> (uVar4 & 0x1f) & 1) != 0)) {
      pLVar3 = (List *)((long)&ppIVar2[-1]->_vptr_Item + *(long *)(&DAT_0011fa00 + (ulong)uVar4 * 8)
                       );
      this->m_curItemList = pLVar3;
    }
    ppIVar2 = ppIVar2 + -1;
  } while (pLVar3 == (List *)0x0);
  if (this->m_curItemList != (List *)0x0) {
    return;
  }
  this->m_curItemList = &this->m_result->resultItems;
  return;
}

Assistant:

void TestResultParser::updateCurrentItemList (void)
{
	m_curItemList = DE_NULL;

	for (vector<ri::Item*>::reverse_iterator i = m_itemStack.rbegin(); i != m_itemStack.rend(); i++)
	{
		ri::Item*	item	= *i;
		ri::Type	type	= item->getType();

		if (type == ri::TYPE_IMAGESET)
			m_curItemList = &static_cast<ri::ImageSet*>(item)->images;
		else if (type == ri::TYPE_SECTION)
			m_curItemList = &static_cast<ri::Section*>(item)->items;
		else if (type == ri::TYPE_EGLCONFIGSET)
			m_curItemList = &static_cast<ri::EglConfigSet*>(item)->configs;
		else if (type == ri::TYPE_SHADERPROGRAM)
			m_curItemList = &static_cast<ri::ShaderProgram*>(item)->shaders;

		if (m_curItemList)
			break;
	}

	if (!m_curItemList)
		m_curItemList = &m_result->resultItems;
}